

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

Byte ppmd_read(void *p)

{
  long *plVar1;
  archive_read *a;
  void *pvVar2;
  Byte BVar3;
  Byte *pBVar4;
  ssize_t bytes_avail;
  
  a = *p;
  pvVar2 = a->format->data;
  bytes_avail = 0;
  pBVar4 = (Byte *)__archive_read_ahead(a,1,&bytes_avail);
  if (bytes_avail < 1) {
    *(undefined1 *)((long)pvVar2 + 0x1ec9) = 1;
    BVar3 = '\0';
  }
  else {
    __archive_read_consume(a,1);
    plVar1 = (long *)((long)pvVar2 + 0x1e0);
    *plVar1 = *plVar1 + 1;
    BVar3 = *pBVar4;
  }
  return BVar3;
}

Assistant:

static Byte
ppmd_read(void* p) {
	/* Get the handle to current decompression context. */
	struct archive_read *a = ((IByteIn*)p)->a;
	struct zip *zip = (struct zip*) a->format->data;
	ssize_t bytes_avail = 0;

	/* Fetch next byte. */
	const uint8_t* data = __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 1) {
		zip->ppmd8_stream_failed = 1;
		return 0;
	}

	__archive_read_consume(a, 1);

	/* Increment the counter. */
	++zip->zipx_ppmd_read_compressed;

	/* Return the next compressed byte. */
	return data[0];
}